

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.c
# Opt level: O2

void BuildTree(char *rawSourceCode)

{
  Lexer *lexer_00;
  char **scope_00;
  Token TVar1;
  undefined8 uVar2;
  uint len;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ASTList *params;
  ulong uVar9;
  ASTNode *nodes;
  uint totalFuncs;
  ASTNode *pAVar10;
  ASTList *paramItems;
  ASTList *pAStack_190;
  undefined1 auStack_188 [16];
  Lexer lexer;
  Scope scope;
  Clock clock;
  Runner runner;
  
  pAStack_190 = (ASTList *)0x103278;
  StartClock((Clock *)&scope.paramItems);
  lexer_00 = (Lexer *)(auStack_188 + 8);
  pAStack_190 = (ASTList *)0x10328a;
  InitLexer(lexer_00,rawSourceCode);
  pAStack_190 = (ASTList *)0x103292;
  len = CountTotalASTTokens(lexer_00);
  pAStack_190 = (ASTList *)0x10329d;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032a5;
  iVar3 = CountTotalScopes(lexer_00);
  pAStack_190 = (ASTList *)0x1032b1;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032b9;
  iVar4 = CountTotalFuncs(lexer_00);
  pAStack_190 = (ASTList *)0x1032c4;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032cc;
  iVar5 = CountTotalFuncCalls(lexer_00);
  pAStack_190 = (ASTList *)0x1032d7;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032df;
  uVar6 = CountTotalParamItems(lexer_00);
  pAStack_190 = (ASTList *)0x1032ea;
  ResetLexer(lexer_00);
  totalFuncs = iVar5 + iVar4;
  params = (ASTList *)(auStack_188 + (ulong)totalFuncs * -0x20);
  paramItems = (ASTList *)((long)params - ((ulong)uVar6 * 0x18 + 0xf & 0xfffffffffffffff0));
  paramItems[-1].size = 0x103324;
  paramItems[-1].nodeId = 0;
  InitParams(params,totalFuncs);
  paramItems[-1].size = 0x103333;
  paramItems[-1].nodeId = 0;
  InitParamItems((ASTListItem *)paramItems,uVar6);
  nodes = (ASTNode *)((long)paramItems - ((ulong)len * 0x38 + 0xf & 0xfffffffffffffff0));
  nodes[-1].meta.funcExpr.params = (ASTList *)0x103356;
  InitNodes(nodes,len);
  pAVar10 = (ASTNode *)((long)nodes - ((ulong)(iVar3 + 1) * 4 + 0xf & 0xfffffffffffffff0));
  lVar7 = 0;
  while (lVar7 <= iVar3) {
    (&pAVar10->type)[lVar7] = (Token)(lVar7 + 1);
    lVar7 = lVar7 + 1;
  }
  scope_00 = &lexer.currentTokenString;
  pAVar10[-1].meta.funcExpr.params = (ASTList *)0x10339a;
  InitScope((Scope *)scope_00);
  lexer.currentTokenString._4_4_ = len;
  scope._24_8_ = nodes;
  scope.nodeSpot = iVar3;
  scope.nodes = pAVar10;
  scope.scopes = (int *)params;
  scope.params = paramItems;
  scope.scopeLength = totalFuncs;
  scope.paramsLength = uVar6;
  lVar7 = (long)scope.nodeLength;
  scope.nodeLength = scope.nodeLength + 1;
  TVar1 = (&pAVar10->type)[lVar7];
  uVar9 = 0;
  pAVar10[-1].meta.funcExpr.params = (ASTList *)0x1033ea;
  ParseStmtList((Scope *)scope_00,(Lexer *)(auStack_188 + 8),TVar1,false);
  lexer.currentTokenString._0_4_ = 0;
  pAVar10[-1].meta.funcExpr.params = (ASTList *)0x1;
  uVar2 = *(undefined8 *)((long)&pAVar10[-1].meta + 0x18);
  pAVar10[-1].meta.funcExpr.params = (ASTList *)0x1033fa;
  EnsureSemantics((Scope *)scope_00,(int)uVar2);
  uVar8 = (ulong)lexer.currentTokenString._4_4_;
  if ((int)lexer.currentTokenString._4_4_ < 1) {
    uVar8 = uVar9;
  }
  uVar6 = 0;
  for (; uVar8 * 0x38 - uVar9 != 0; uVar9 = uVar9 + 0x38) {
    if (((*(uint *)(scope._24_8_ + uVar9) | 8) == 0x68) ||
       (*(uint *)(scope._24_8_ + uVar9) - 0x40 < 0xb)) {
      uVar6 = uVar6 + 1;
    }
  }
  lVar7 = -((ulong)uVar6 + 0xf & 0xfffffffffffffff0) -
          ((ulong)uVar6 * 0x18 + 0xf & 0xfffffffffffffff0);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar6) {
    uVar9 = (ulong)uVar6;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    *(undefined1 *)((long)pAVar10 + uVar8 + lVar7) = 0;
  }
  *(undefined8 *)((long)pAVar10 + lVar7 + -8) = 0x103494;
  InitRunner((Runner *)&clock.elapsed,(Scope *)&lexer.currentTokenString);
  TVar1 = (scope.nodes)->type;
  *(undefined8 *)((long)pAVar10 + lVar7 + -8) = 0x1034a2;
  Run((Runner *)&clock.elapsed,TVar1);
  *(undefined8 *)((long)pAVar10 + lVar7 + -8) = 0x1034ae;
  DestroyLexer((Lexer *)(auStack_188 + 8));
  *(undefined8 *)((long)pAVar10 + lVar7 + -8) = 0x1034ba;
  DestroyNodes(nodes,len);
  *(undefined8 *)((long)pAVar10 + lVar7 + -8) = 0x1034c2;
  DestroyScope((Scope *)&lexer.currentTokenString);
  *(undefined8 *)((long)pAVar10 + lVar7 + -8) = 0x1034ce;
  EndClock((Clock *)&scope.paramItems);
  return;
}

Assistant:

void BuildTree(char* rawSourceCode){
	Clock clock;
	StartClock(&clock);

	DEBUG_PRINT("\n\n------Starting Program------\n");

	// Build Lexer
	Lexer lexer;
	InitLexer(&lexer, rawSourceCode);

	// Pre-allocate memory
	// The heap is 3,000% slower than just using stack
	// memory. So we are pre-allocating the memory
	// using the stack
	int totalNodes = CountTotalASTTokens(&lexer);
	ResetLexer(&lexer);
	int totalScopes = CountTotalScopes(&lexer);
	ResetLexer(&lexer);
	int totalFuncs = CountTotalFuncs(&lexer);
	ResetLexer(&lexer);
	int totalFuncCalls = CountTotalFuncCalls(&lexer);
	ResetLexer(&lexer);
	int totalParamItems = CountTotalParamItems(&lexer);
	ResetLexer(&lexer);

	// Pre-allocate the different param lists
	ASTList params[totalFuncs + totalFuncCalls];
	ASTListItem paramItems[totalParamItems];
	InitParams(params, totalFuncs + totalFuncCalls);
	InitParamItems(paramItems, totalParamItems);

	// Pre-allocate the different variable types
	ASTNode nodes[totalNodes];
	InitNodes(nodes, totalNodes);

	// Pre-allocate the different scopes
	int scopes[totalScopes + 1];
	for (int i = 0; i < totalScopes + 1; i++) scopes[i] = i + 1;

	// Build the scope
	Scope scope;
	InitScope(&scope);
	scope.nodeLength = totalNodes;
	scope.nodes = nodes;
	scope.scopeLength = totalScopes;
	scope.scopes = scopes;

	scope.params = params;
	scope.paramItems = paramItems;
	scope.paramsLength = totalFuncs + totalFuncCalls;
	scope.paramItemsLength = totalParamItems;

	// Let's build the tree
	ParseStmtList(&scope, &lexer, scope.scopes[scope.scopeSpot++], false);
	scope.nodeSpot = 0;
	EnsureSemantics(&scope, 1);

	#if EXPAND_AST
	char* json = ExpandScope(&scope, 0);
	WriteToFile("compiled.json", json);
	#endif

	int totalVars = 0;
	for (int i = 0; i < scope.nodeLength; i++){
		if (scope.nodes[i].type == VAR ||
				scope.nodes[i].type == RETURN ||
				(scope.nodes[i].type > BEGIN_NUMBER && 
				 scope.nodes[i].type < END_STRING)) totalVars++;
	}

	Runner runner;
	RunnerContext runnerContexts[totalVars];
	runner.contexts = runnerContexts;
	bool contextUsed[totalVars];
	runner.contextUsed = contextUsed;

	for (int i = 0; i < totalVars; i++) {
		runner.contextUsed[i] = false;
	}

	runner.totalContexts = totalVars;
	InitRunner(&runner, &scope);
	Run(&runner, scope.scopes[0]);


	// Cleanup
	DestroyLexer(&lexer);
	DestroyNodes(nodes, totalNodes);
	DestroyScope(&scope);

	EndClock(&clock);
	DEBUG_PRINT("\n\n------Program Completed------\n");
	DEBUG_PRINT("\n\n------Program Stats------\n");
	#if DEBUG == 1
	printf("Time: %lld nanoseconds\n", GetClockNanosecond(&clock));
	
	#endif
}